

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O1

void __thiscall sznet::MinHeap<event>::checkHeap(MinHeap<event> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar1 = this->m_size - 1;
  if (uVar1 != 0) {
    uVar2 = uVar1;
    do {
      uVar4 = (ulong)uVar1;
      uVar5 = uVar1 - 1;
      bVar7 = uVar1 == 0;
      uVar1 = uVar1 - 1;
      uVar6 = (ulong)(uVar5 >> 1);
      if (bVar7) {
        uVar6 = 0;
      }
      iVar3 = (*this->m_pCmpFunc)(this->m_ptrArr[uVar6],this->m_ptrArr[uVar4]);
      if (iVar3 == 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/../../sznet/ds/MinHeap.h"
                      ,0xe9,"void sznet::MinHeap<event>::checkHeap() [T = event]");
      }
    } while (((int)uVar6 != 0) || (uVar1 = uVar2 - 1, uVar2 = uVar1, uVar1 != 0));
  }
  return;
}

Assistant:

void checkHeap()
	{
		for (uint32_t index = (m_size - 1); index > 0; --index)
		{
			uint32_t curIndex = index;
			while (true)
			{
				// 当前节点下标的爸爸下标
				uint32_t parent_index = parent(curIndex);
				// 判断父亲节点是否比当前节点小
				auto r = m_pCmpFunc(m_ptrArr[parent_index], m_ptrArr[curIndex]);
				if (r == 1)
				{
					// 不要那就错了
					assert(0);
				}
				if (parent_index == 0)
				{
					break;
				}
				--curIndex;
			}
		}
	}